

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void anon_unknown.dwarf_deef1e::InheritQualifiers(TQualifier *child,TQualifier *parent)

{
  if (*(ulong *)&child->field_0x8 >> 0x3d == 0) {
    *(ulong *)&child->field_0x8 =
         *(ulong *)&parent->field_0x8 & 0xe000000000000000 | *(ulong *)&child->field_0x8;
  }
  if ((parent->field_0xb & 0x10) != 0) {
    child->field_0xb = child->field_0xb | 0x10;
  }
  if ((parent->field_0xb & 0x80) != 0) {
    child->field_0xb = child->field_0xb | 0x80;
  }
  if ((parent->field_0xb & 0x20) != 0) {
    child->field_0xb = child->field_0xb | 0x20;
  }
  if ((parent->field_0xc & 0x20) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x2000000000;
  }
  if ((parent->field_0xc & 0x40) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x4000000000;
  }
  if ((parent->field_0xd & 2) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x20000000000;
  }
  if ((parent->field_0xd & 4) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x40000000000;
  }
  if ((parent->field_0xd & 8) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x80000000000;
  }
  if ((*(uint *)&parent->field_0x8 & 0x7f) == 0xf) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffffffffffff80 | 0xf;
  }
  if ((parent->field_0xd & 0x10) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x100000000000;
  }
  if ((parent->field_0xd & 0x20) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x200000000000;
  }
  if ((parent->field_0xe & 2) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x2000000000000;
  }
  if ((parent->field_0xe & 0x10) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x10000000000000;
  }
  if ((parent->field_0xe & 0x20) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x20000000000000;
  }
  if ((parent->field_0xe & 0x40) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x40000000000000;
  }
  if ((parent->field_0xe & 0x80) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x80000000000000;
  }
  if ((parent->field_0xf & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x100000000000000;
  }
  if ((parent->field_0xf & 2) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x200000000000000;
  }
  if ((parent->field_0xe & 4) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x4000000000000;
  }
  if ((parent->field_0xe & 8) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x8000000000000;
  }
  if ((parent->field_0xd & 0x40) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x400000000000;
  }
  if ((parent->field_0xd & 0x80) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x800000000000;
  }
  if ((parent->field_0xe & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x1000000000000;
  }
  if ((parent->field_0xc & 2) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 | 0x200000000;
  }
  return;
}

Assistant:

void InheritQualifiers(glslang::TQualifier& child, const glslang::TQualifier& parent)
{
    if (child.layoutMatrix == glslang::ElmNone)
        child.layoutMatrix = parent.layoutMatrix;

    if (parent.invariant)
        child.invariant = true;
    if (parent.flat)
        child.flat = true;
    if (parent.centroid)
        child.centroid = true;
    if (parent.nopersp)
        child.nopersp = true;
    if (parent.explicitInterp)
        child.explicitInterp = true;
    if (parent.perPrimitiveNV)
        child.perPrimitiveNV = true;
    if (parent.perViewNV)
        child.perViewNV = true;
    if (parent.perTaskNV)
        child.perTaskNV = true;
    if (parent.storage == glslang::EvqtaskPayloadSharedEXT)
        child.storage = glslang::EvqtaskPayloadSharedEXT;
    if (parent.patch)
        child.patch = true;
    if (parent.sample)
        child.sample = true;
    if (parent.coherent)
        child.coherent = true;
    if (parent.devicecoherent)
        child.devicecoherent = true;
    if (parent.queuefamilycoherent)
        child.queuefamilycoherent = true;
    if (parent.workgroupcoherent)
        child.workgroupcoherent = true;
    if (parent.subgroupcoherent)
        child.subgroupcoherent = true;
    if (parent.shadercallcoherent)
        child.shadercallcoherent = true;
    if (parent.nonprivate)
        child.nonprivate = true;
    if (parent.volatil)
        child.volatil = true;
    if (parent.nontemporal)
        child.nontemporal = true;
    if (parent.restrict)
        child.restrict = true;
    if (parent.readonly)
        child.readonly = true;
    if (parent.writeonly)
        child.writeonly = true;
    if (parent.nonUniform)
        child.nonUniform = true;
}